

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O1

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,sunrealtype tol,
              int callSetup,void *mem)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 *__s;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  double *pdVar13;
  long lVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  undefined1 (*pauVar19) [16];
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  void *pvVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  double *pdVar28;
  undefined1 (*pauVar29) [16];
  uint uVar30;
  int iVar31;
  double *pdVar32;
  ulong uVar33;
  long lVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  int iVar45;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  
  pvVar24 = NLS->content;
  uVar5 = *(undefined8 *)((long)pvVar24 + 0x68);
  uVar6 = *(undefined8 *)((long)pvVar24 + 0x70);
  uVar7 = *(undefined8 *)((long)pvVar24 + 0x88);
  *(undefined4 *)((long)pvVar24 + 0x90) = 0;
  *(undefined8 *)((long)pvVar24 + 0x98) = 0;
  *(undefined8 *)((long)pvVar24 + 0xa0) = 0;
  pvVar24 = NLS->content;
  if (*(int *)((long)pvVar24 + 0x90) < *(int *)((long)pvVar24 + 0x94)) {
    do {
      N_VScale(ycor,uVar5);
      iVar17 = (**NLS->content)(ycor,uVar6,mem);
      if (iVar17 != 0) {
        return iVar17;
      }
      pvVar24 = NLS->content;
      uVar3 = *(uint *)((long)pvVar24 + 0x10);
      uVar27 = (ulong)uVar3;
      if (uVar27 == 0) {
        N_VScale(0x3ff0000000000000,uVar6,ycor);
      }
      else {
        uVar4 = *(uint *)((long)pvVar24 + 0x90);
        __s = *(undefined4 **)((long)pvVar24 + 0x18);
        uVar8 = *(undefined8 *)((long)pvVar24 + 0x80);
        uVar9 = *(undefined8 *)((long)pvVar24 + 0x78);
        lVar10 = *(long *)((long)pvVar24 + 0x48);
        lVar23 = *(long *)((long)pvVar24 + 0x50);
        lVar20 = *(long *)((long)pvVar24 + 0x58);
        puVar11 = *(undefined8 **)((long)pvVar24 + 0x40);
        puVar12 = *(undefined8 **)((long)pvVar24 + 0x60);
        pdVar13 = *(double **)((long)pvVar24 + 0x30);
        lVar14 = *(long *)((long)pvVar24 + 0x38);
        uVar15 = *(undefined8 *)((long)pvVar24 + 0x88);
        iVar17 = *(int *)((long)pvVar24 + 0x20);
        dVar36 = *(double *)((long)pvVar24 + 0x28);
        if (0 < (int)uVar3) {
          memset(__s,0,uVar27 * 4);
        }
        uVar18 = uVar4 - 1;
        uVar26 = (long)(int)uVar18 % (long)(int)uVar3 & 0xffffffff;
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,uVar6,uVar5,uVar15);
        uVar30 = (uint)((long)(int)uVar18 % (long)(int)uVar3);
        if (0 < (int)uVar4) {
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,uVar6,uVar8,
                       *(undefined8 *)(lVar23 + (long)(int)uVar30 * 8));
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,uVar15,uVar9,
                       *(undefined8 *)(lVar10 + (long)(int)uVar30 * 8));
        }
        N_VScale(0x3ff0000000000000,uVar6,uVar8);
        N_VScale(0x3ff0000000000000,uVar15);
        if (uVar4 == 1) {
          uVar8 = *(undefined8 *)(lVar10 + uVar26 * 8);
          dVar35 = (double)N_VDotProd(uVar8,uVar8);
          *pdVar13 = dVar35;
          dVar38 = 0.0;
          if (0.0 < dVar35) {
            if (dVar35 < 0.0) {
              dVar38 = sqrt(dVar35);
            }
            else {
              dVar38 = SQRT(dVar35);
            }
          }
          *pdVar13 = dVar38;
          N_VScale(1.0 / dVar38,*(undefined8 *)(lVar10 + uVar26 * 8),
                   *(undefined8 *)(lVar20 + uVar26 * 8));
          *__s = 0;
        }
        else {
          if (uVar4 == 0) {
            N_VScale(0x3ff0000000000000,uVar6,ycor);
            goto LAB_0011f7cf;
          }
          if ((int)uVar4 <= (int)uVar3) {
            N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar10 + (long)(int)uVar30 * 8),ycor);
            if (1 < (int)uVar4) {
              uVar26 = 0;
              do {
                __s[uVar26] = (int)uVar26;
                dVar35 = (double)N_VDotProd(*(undefined8 *)(lVar20 + uVar26 * 8),ycor);
                pdVar13[(long)(int)(uVar18 * uVar3) + uVar26] = dVar35;
                N_VLinearSum(0x3ff0000000000000,-dVar35,ycor,*(undefined8 *)(lVar20 + uVar26 * 8),
                             ycor);
                uVar26 = uVar26 + 1;
              } while (uVar18 != uVar26);
            }
            dVar35 = (double)N_VDotProd(ycor,ycor);
            lVar22 = (long)(int)(uVar3 * uVar18 + uVar4);
            pdVar13[lVar22 + -1] = dVar35;
            dVar38 = 0.0;
            if (0.0 < dVar35) {
              if (dVar35 < 0.0) {
                dVar38 = sqrt(dVar35);
              }
              else {
                dVar38 = SQRT(dVar35);
              }
            }
            pdVar13[lVar22 + -1] = dVar38;
            N_VScale(~-(ulong)(dVar38 == 0.0) & (ulong)(1.0 / dVar38),ycor,
                     *(undefined8 *)(lVar20 + (long)(int)uVar30 * 8));
            __s[(int)uVar18] = uVar18;
            goto LAB_0011f5c7;
          }
          if ((int)uVar3 < 2) {
LAB_0011f326:
            N_VScale(*(undefined8 *)(lVar10 + (long)(int)uVar30 * 8),ycor);
          }
          else {
            uVar25 = (ulong)(uVar3 - 1);
            pauVar29 = (undefined1 (*) [16])(pdVar13 + uVar27 * 2);
            uVar33 = 2;
            uVar26 = 0;
            do {
              uVar1 = uVar26 + 1;
              uVar21 = (ulong)(uVar3 * (int)uVar1);
              auVar43 = *(undefined1 (*) [16])(pdVar13 + uVar26 + uVar21);
              dVar38 = auVar43._0_8_ * auVar43._0_8_ + auVar43._8_8_ * auVar43._8_8_;
              dVar35 = 0.0;
              if (0.0 < dVar38) {
                if (dVar38 < 0.0) {
                  dVar35 = sqrt(dVar38);
                }
                else {
                  dVar35 = SQRT(dVar38);
                }
              }
              auVar39._8_8_ = dVar35;
              auVar39._0_8_ = dVar35;
              auVar43 = divpd(auVar43,auVar39);
              pdVar13[uVar26 + uVar21] = dVar35;
              pdVar13[uVar26 + uVar21 + 1] = 0.0;
              dVar35 = auVar43._0_8_;
              if ((int)uVar26 + 2 < (int)uVar3) {
                pauVar19 = pauVar29;
                uVar21 = uVar27;
                do {
                  auVar46._8_8_ =
                       *(double *)*pauVar19 * -auVar43._8_8_ +
                       *(double *)((long)*pauVar19 + 8) * dVar35;
                  auVar46._0_8_ =
                       *(double *)*pauVar19 * dVar35 +
                       *(double *)((long)*pauVar19 + 8) * auVar43._8_8_;
                  *pauVar19 = auVar46;
                  uVar21 = uVar21 - 1;
                  pauVar19 = (undefined1 (*) [16])((long)*pauVar19 + uVar27 * 8);
                } while (uVar33 != uVar21);
              }
              N_VLinearSum(dVar35,*(undefined8 *)(lVar20 + uVar26 * 8),
                           *(undefined8 *)(lVar20 + uVar1 * 8),ycor);
              N_VLinearSum(*(undefined8 *)(lVar20 + uVar26 * 8),*(undefined8 *)(lVar20 + uVar1 * 8))
              ;
              N_VScale(0x3ff0000000000000,ycor,*(undefined8 *)(lVar20 + uVar26 * 8));
              uVar33 = uVar33 + 1;
              pauVar29 = (undefined1 (*) [16])((long)*pauVar29 + (uVar27 + 1) * 8);
              uVar26 = uVar1;
            } while (uVar1 != uVar25);
            if ((int)uVar3 < 2) goto LAB_0011f326;
            uVar33 = 1;
            pdVar28 = pdVar13;
            uVar26 = uVar25;
            pdVar32 = pdVar13;
            do {
              do {
                *pdVar28 = pdVar28[uVar27];
                uVar26 = uVar26 - 1;
                pdVar28 = pdVar28 + 1;
              } while (uVar26 != 0);
              uVar33 = uVar33 + 1;
              pdVar28 = pdVar32 + uVar27;
              uVar26 = uVar25;
              pdVar32 = pdVar28;
            } while (uVar33 != uVar27);
            N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar10 + (long)(int)uVar30 * 8),ycor);
            if (1 < (int)uVar3) {
              uVar26 = 0;
              do {
                dVar35 = (double)N_VDotProd(*(undefined8 *)(lVar20 + uVar26 * 8),ycor);
                pdVar13[(long)(int)((uVar3 - 1) * uVar3) + uVar26] = dVar35;
                N_VLinearSum(0x3ff0000000000000,-dVar35,ycor,*(undefined8 *)(lVar20 + uVar26 * 8),
                             ycor);
                uVar26 = uVar26 + 1;
              } while (uVar25 != uVar26);
            }
          }
          dVar35 = (double)N_VDotProd(ycor,ycor);
          pdVar13[(long)(int)(uVar3 * uVar3) + -1] = dVar35;
          dVar38 = 0.0;
          if (0.0 < dVar35) {
            if (dVar35 < 0.0) {
              dVar38 = sqrt(dVar35);
            }
            else {
              dVar38 = SQRT(dVar35);
            }
          }
          pdVar13[(long)(int)(uVar3 * uVar3) + -1] = dVar38;
          N_VScale(1.0 / dVar38,ycor);
          auVar46 = _DAT_00120070;
          auVar39 = _DAT_00120060;
          auVar43 = _DAT_00120050;
          uVar18 = uVar30 + 1;
          if ((int)uVar18 < (int)uVar3) {
            uVar26 = 0;
            do {
              __s[uVar26] = uVar18 + (int)uVar26;
              uVar26 = uVar26 + 1;
            } while (~uVar30 + uVar3 != uVar26);
            uVar26 = uVar26 & 0xffffffff;
          }
          else {
            uVar26 = 0;
          }
          if (-1 < (int)uVar30) {
            lVar22 = (ulong)uVar18 - 1;
            auVar37._8_4_ = (int)lVar22;
            auVar37._0_8_ = lVar22;
            auVar37._12_4_ = (int)((ulong)lVar22 >> 0x20);
            uVar25 = 0;
            do {
              iVar31 = (int)uVar25;
              auVar40._8_4_ = iVar31;
              auVar40._0_8_ = uVar25;
              auVar40._12_4_ = (int)(uVar25 >> 0x20);
              auVar44 = (auVar40 | auVar39) ^ auVar46;
              iVar41 = SUB164(auVar37 ^ auVar46,0);
              bVar16 = iVar41 < auVar44._0_4_;
              iVar42 = SUB164(auVar37 ^ auVar46,4);
              iVar45 = auVar44._4_4_;
              if ((bool)(~(iVar42 < iVar45 || iVar45 == iVar42 && bVar16) & 1)) {
                __s[uVar26 + uVar25] = iVar31;
              }
              if (iVar42 >= iVar45 && (iVar45 != iVar42 || !bVar16)) {
                __s[uVar26 + uVar25 + 1] = iVar31 + 1;
              }
              auVar40 = (auVar40 | auVar43) ^ auVar46;
              iVar45 = auVar40._4_4_;
              if (iVar45 <= iVar42 && (iVar45 != iVar42 || auVar40._0_4_ <= iVar41)) {
                __s[uVar26 + uVar25 + 2] = iVar31 + 2;
                __s[uVar26 + uVar25 + 3] = iVar31 + 3;
              }
              uVar25 = uVar25 + 4;
            } while ((uVar30 + 4 & 0xfffffffc) != uVar25);
          }
        }
LAB_0011f5c7:
        uVar26 = (ulong)uVar4;
        if ((int)uVar3 < (int)uVar4) {
          uVar26 = uVar27;
        }
        iVar31 = (int)uVar26;
        N_VDotProdMulti(uVar26,uVar15,lVar20,lVar14);
        *puVar11 = 0x3ff0000000000000;
        *puVar12 = uVar6;
        if (iVar31 < 1) {
          uVar27 = 1;
        }
        else {
          lVar20 = (long)(int)uVar3;
          pdVar28 = (double *)((long)pdVar13 + (lVar20 * 8 + 8) * uVar26 + -8);
          uVar27 = 1;
          lVar22 = 0;
          uVar25 = uVar26;
          do {
            uVar33 = uVar25 - 1;
            if ((long)uVar25 < (long)uVar26) {
              dVar35 = *(double *)(lVar14 + uVar33 * 8);
              pdVar32 = pdVar28;
              lVar34 = lVar22;
              do {
                dVar35 = dVar35 - *pdVar32 * *(double *)(uVar26 * 8 + lVar14 + lVar34 * 8);
                *(double *)(lVar14 + uVar33 * 8) = dVar35;
                lVar34 = lVar34 + 1;
                pdVar32 = pdVar32 + lVar20;
              } while ((int)lVar34 != 0);
            }
            dVar35 = *(double *)(lVar14 + uVar33 * 8);
            dVar38 = 0.0;
            if ((dVar35 != 0.0) || (NAN(dVar35))) {
              dVar38 = dVar35 / pdVar13[(int)((uVar3 + 1) * (int)uVar33)];
            }
            *(double *)(lVar14 + uVar33 * 8) = dVar38;
            puVar11[uVar27] = -dVar38;
            puVar12[uVar27] = *(undefined8 *)(lVar23 + (long)(int)__s[uVar33] * 8);
            uVar27 = uVar27 + 1;
            lVar22 = lVar22 + -1;
            pdVar28 = (double *)((long)pdVar28 + (lVar20 * 8 ^ 0xfffffffffffffff8U));
            uVar25 = uVar33;
          } while (uVar27 != iVar31 + 1);
        }
        if (iVar17 != 0) {
          dVar36 = 1.0 - dVar36;
          uVar26 = uVar27 & 0xffffffff;
          puVar11[uVar26] = -dVar36;
          puVar12[uVar26] = uVar15;
          if (iVar31 < 1) {
            uVar27 = (ulong)((int)uVar27 + 1);
          }
          else {
            uVar26 = uVar26 + 1;
            lVar23 = (ulong)(iVar31 - 1) + 1;
            do {
              puVar11[uVar26] = *(double *)(lVar14 + -8 + lVar23 * 8) * dVar36;
              puVar12[uVar26] = *(undefined8 *)(lVar10 + (long)(int)__s[lVar23 + -1] * 8);
              uVar26 = uVar26 + 1;
              lVar20 = lVar23 + -1;
              bVar16 = 0 < lVar23;
              lVar23 = lVar20;
            } while (lVar20 != 0 && bVar16);
            uVar27 = uVar26 & 0xffffffff;
          }
        }
        N_VLinearCombination(uVar27,puVar11,puVar12,ycor);
      }
LAB_0011f7cf:
      plVar2 = (long *)((long)NLS->content + 0x98);
      *plVar2 = *plVar2 + 1;
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ycor,uVar5,uVar7);
      iVar17 = (**(code **)((long)NLS->content + 8))
                         (tol,NLS,ycor,uVar7,w,*(undefined8 *)((long)NLS->content + 0xa8));
      if (iVar17 != 0x385) {
        if (iVar17 == 0) {
          return 0;
        }
        pvVar24 = NLS->content;
        goto LAB_0011f85d;
      }
      pvVar24 = NLS->content;
      iVar17 = *(int *)((long)pvVar24 + 0x90) + 1;
      *(int *)((long)pvVar24 + 0x90) = iVar17;
    } while (iVar17 < *(int *)((long)pvVar24 + 0x94));
  }
  iVar17 = 0x386;
LAB_0011f85d:
  *(long *)((long)pvVar24 + 0xa0) = *(long *)((long)pvVar24 + 0xa0) + 1;
  return iVar17;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS,
                                 SUNDIALS_MAYBE_UNUSED N_Vector y0,
                                 N_Vector ycor, N_Vector w, sunrealtype tol,
                                 SUNDIALS_MAYBE_UNUSED sunbooleantype callSetup,
                                 void* mem)
{
  SUNFunctionBegin(NLS->sunctx);
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that all required function pointers have been set */
  SUNAssert(FP_CONTENT(NLS)->Sys && FP_CONTENT(NLS)->CTest, SUN_ERR_ARG_CORRUPT);

  SUNLogInfo(NLS->sunctx->logger, "nonlinear-solver", "solver = Fixed-Point");

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* initialize iteration and convergence fail counters for this solve */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for (FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++)
  {
    SUNLogInfo(NLS->sunctx->logger, "begin-nonlinear-iterate", "");

    /* update previous solution guess */
    N_VScale(ONE, ycor, yprev);
    SUNCheckLastErr();

    /* Compute fixed-point iteration function, store in gy.
       We do not use SUNCheck macros here because Sys is an integrator-provided
       callback and returns integrator specific error values  where 0 == success,
       < 0 is a failure, > 0 is recoverable error. */
    retval = FP_CONTENT(NLS)->Sys(ycor, gy, mem);
    if (retval != 0)
    {
      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = failed nonlinear system evaluation, retval = %d",
                 retval);
      return retval;
    }

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0)
    { /* basic fixed-point solver */
      N_VScale(ONE, gy, ycor);
      SUNCheckLastErr();
    }
    else
    { /* Anderson-accelerated solver */
      SUNCheckCall(
        AndersonAccelerate(NLS, gy, ycor, yprev, FP_CONTENT(NLS)->curiter));
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, ycor, -ONE, yprev, delta);
    SUNCheckLastErr();

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                    FP_CONTENT(NLS)->ctest_data);

    SUNLogInfo(NLS->sunctx->logger, "nonlinear-iterate",
               "cur-iter = %d, update-norm = %.16g", FP_CONTENT(NLS)->niters,
               N_VWrmsNorm(delta, w));

    /* return if successful */
    if (retval == 0)
    {
      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = success");
      return SUN_SUCCESS;
    }

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE)
    {
      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = failed, retval = %i", retval);
      FP_CONTENT(NLS)->nconvfails++;
      return (retval);
    }

    SUNLogInfoIf(FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters - 1,
                 NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = continue");
  }

  SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
             "status = failed max iterations");

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return SUN_NLS_CONV_RECVR;
}